

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O2

string * __thiscall Entity::toString_abi_cxx11_(Entity *this)

{
  string *this_00;
  allocator local_19;
  
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,"Not implemented",&local_19);
  return this_00;
}

Assistant:

string* Entity::toString() {
    return new string("Not implemented");
}